

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool Datetime::valid(int y,int d)

{
  uint uVar1;
  
  if (d < 1 || y < 0) {
    return false;
  }
  uVar1 = daysInYear(y);
  return (uint)d <= uVar1;
}

Assistant:

bool Datetime::valid (const int y, const int d)
{
  // Check that the year is valid.
  if (y < 0)
    return false;

  if (d < 1 || d > Datetime::daysInYear (y))
    return false;

  return true;
}